

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindGenericRoundFunctionDecimal<duckdb::FloorDecimalOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *other;
  Expression EVar1;
  char cVar2;
  uchar uVar3;
  reference this_00;
  pointer pEVar4;
  reference this_01;
  code *__f;
  LogicalType aLStack_48 [24];
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  other = (LogicalType *)(pEVar4 + 0x38);
  cVar2 = duckdb::DecimalType::GetScale(other);
  uVar3 = duckdb::DecimalType::GetWidth(other);
  if (cVar2 == '\0') {
    __f = duckdb::ScalarFunction::NopFunction;
  }
  else {
    EVar1 = pEVar4[0x39];
    if (EVar1 == (Expression)0x9) {
      __f = GenericRoundFunctionDecimal<long,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else if (EVar1 == (Expression)0x7) {
      __f = GenericRoundFunctionDecimal<int,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else if (EVar1 == (Expression)0x5) {
      __f = GenericRoundFunctionDecimal<short,duckdb::NumericHelper,duckdb::FloorDecimalOperator>;
    }
    else {
      __f = 
      GenericRoundFunctionDecimal<duckdb::hugeint_t,duckdb::Hugeint,duckdb::FloorDecimalOperator>;
    }
  }
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
            ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
             &bound_function->function,__f);
  this_01 = vector<duckdb::LogicalType,_true>::get<true>
                      ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
  LogicalType::operator=(this_01,other);
  duckdb::LogicalType::DECIMAL((uchar)aLStack_48,uVar3);
  LogicalType::operator=((LogicalType *)&bound_function->field_0x90,aLStack_48);
  duckdb::LogicalType::~LogicalType(aLStack_48);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindGenericRoundFunctionDecimal(ClientContext &context, ScalarFunction &bound_function,
                                                         vector<unique_ptr<Expression>> &arguments) {
	// ceil essentially removes the scale
	auto &decimal_type = arguments[0]->return_type;
	auto scale = DecimalType::GetScale(decimal_type);
	auto width = DecimalType::GetWidth(decimal_type);
	if (scale == 0) {
		bound_function.function = ScalarFunction::NopFunction;
	} else {
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = GenericRoundFunctionDecimal<int16_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT32:
			bound_function.function = GenericRoundFunctionDecimal<int32_t, NumericHelper, OP>;
			break;
		case PhysicalType::INT64:
			bound_function.function = GenericRoundFunctionDecimal<int64_t, NumericHelper, OP>;
			break;
		default:
			bound_function.function = GenericRoundFunctionDecimal<hugeint_t, Hugeint, OP>;
			break;
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, 0);
	return nullptr;
}